

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_not_mtsafe_st_env_infrastructure.cpp
# Opt level: O2

void __thiscall
so_5::env_infrastructures::simple_not_mtsafe::impl::
env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>::
perform_shutdown_related_actions_if_needed
          (env_infrastructure_t<so_5::env_infrastructures::st_reusable_stuff::fake_activity_tracker_t>
           *this)

{
  bool bVar1;
  shutdown_status_t sVar2;
  
  sVar2 = this->m_shutdown_status;
  if (sVar2 == must_be_started) {
    this->m_shutdown_status = in_progress;
    so_5::impl::coop_repository_basis_t::deregister_all_coop
              (&(this->m_coop_repo).super_coop_repository_basis_t);
    sVar2 = this->m_shutdown_status;
  }
  if (sVar2 == in_progress) {
    bVar1 = st_reusable_stuff::coop_repo_t::has_live_coop(&this->m_coop_repo);
    if (!bVar1) {
      this->m_shutdown_status = completed;
    }
  }
  return;
}

Assistant:

void
env_infrastructure_t< ACTIVITY_TRACKER >::perform_shutdown_related_actions_if_needed()
	{
		if( shutdown_status_t::must_be_started == m_shutdown_status )
			{
				// Shutdown procedure must be started.
				m_shutdown_status = shutdown_status_t::in_progress;

				// All registered cooperations must be deregistered now.
				m_coop_repo.deregister_all_coop();
			}

		if( shutdown_status_t::in_progress == m_shutdown_status )
			{
				// If there is no more live coops then shutdown must be completed.
				if( !m_coop_repo.has_live_coop() )
					m_shutdown_status = shutdown_status_t::completed;
			}
	}